

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_BufCountNonCritical(Buf_Man_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint Entry;
  Abc_Obj_t *pFan;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  Buf_Man_t *p_local;
  
  Vec_IntClear(p->vNonCrit);
  for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
    pFan = Abc_ObjFanout(pObj,local_24);
    iVar1 = Abc_BufEdgeSlack(p,pObj,pFan);
    if (0xdac < iVar1) {
      p_00 = p->vNonCrit;
      Entry = Abc_ObjId(pFan);
      Vec_IntPush(p_00,Entry);
    }
  }
  iVar1 = Vec_IntSize(p->vNonCrit);
  return iVar1;
}

Assistant:

int Abc_BufCountNonCritical( Buf_Man_t * p, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    Vec_IntClear( p->vNonCrit );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_BufEdgeSlack( p, pObj, pFanout ) > 7*BUF_SCALE/2 )
            Vec_IntPush( p->vNonCrit, Abc_ObjId(pFanout) );
    return Vec_IntSize(p->vNonCrit);
}